

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

bool __thiscall
llama_model_loader::get_key_or_arr<unsigned_int,512ul>
          (llama_model_loader *this,string *key,array<unsigned_int,_512UL> *result,uint32_t n,
          bool required)

{
  bool bVar1;
  uint k;
  int iVar2;
  runtime_error *prVar3;
  ulong uVar4;
  uint value;
  ArrayInfo arr_info;
  
  k = gguf_find_key((this->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t
                    .super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                    super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                    (key->_M_dataplus)._M_p);
  if ((int)k < 0) {
    if (required) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_((string *)&value,"key not found in model: %s",(key->_M_dataplus)._M_p);
      std::runtime_error::runtime_error(prVar3,(string *)&value);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = false;
  }
  else {
    if (0x200 < n) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_((string *)&value,"n > N_MAX: %u > %u for key %s",(ulong)n,0x200,
                        (key->_M_dataplus)._M_p);
      std::runtime_error::runtime_error(prVar3,(string *)&value);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = gguf_get_kv_type((this->meta)._M_t.
                             super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                             super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                             super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                             k & 0x7fffffff);
    if (iVar2 == 9) {
      GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv
                (&arr_info,
                 (this->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                 super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                 super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,k);
      if (CONCAT44(arr_info.length._4_4_,(uint)arr_info.length) != (ulong)n) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_((string *)&value,"key %s has wrong array length; expected %u, got %u",
                          (key->_M_dataplus)._M_p,(ulong)n,(ulong)(uint)arr_info.length);
        std::runtime_error::runtime_error(prVar3,(string *)&value);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar1 = get_arr<unsigned_int,512ul>(this,key,result,required);
    }
    else {
      bVar1 = get_key<unsigned_int>(this,key,&value,required);
      if (bVar1) {
        for (uVar4 = 0; n != uVar4; uVar4 = uVar4 + 1) {
          result->_M_elems[uVar4] = value;
        }
      }
    }
  }
  return bVar1;
}

Assistant:

bool llama_model_loader::get_key_or_arr(const std::string & key, std::array<T, N_MAX> & result, uint32_t n, bool required) {
        const int kid = gguf_find_key(meta.get(), key.c_str());

        if (kid < 0) {
            if (required) {
                throw std::runtime_error(format("key not found in model: %s", key.c_str()));
            }
            return false;
        }

        if (n > N_MAX) {
            throw std::runtime_error(format("n > N_MAX: %u > %u for key %s", (uint32_t) n, (uint32_t) N_MAX, key.c_str()));
        }

        if (gguf_get_kv_type(meta.get(), kid) == GGUF_TYPE_ARRAY) {
            struct GGUFMeta::ArrayInfo arr_info =
                GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv(meta.get(), kid);

            if (n != arr_info.length) {
                throw std::runtime_error(format("key %s has wrong array length; expected %u, got %u", key.c_str(), n, (uint32_t) arr_info.length));
            }

            return get_arr(key, result, required);
        }

        T value;

        bool ok = get_key(key, value, required);
        if (!ok) {
            return false;
        }

        for (uint32_t i = 0; i < n; i++) {
            result[i] = value;
        }

        return true;
    }